

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  Rep *pRVar2;
  int iVar3;
  Extension *pEVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  LogMessage *other;
  MessageLite *pMVar7;
  LogFinisher local_61;
  LogMessage local_60;
  long *plVar6;
  
  pEVar4 = MaybeNewRepeatedExtension(this,descriptor);
  pRVar1 = (pEVar4->field_0).repeated_string_value;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar3 = (pRVar1->super_RepeatedPtrFieldBase).current_size_;
    if (iVar3 < pRVar2->allocated_size) {
      (pRVar1->super_RepeatedPtrFieldBase).current_size_ = iVar3 + 1;
      pMVar7 = (MessageLite *)pRVar2->elements[iVar3];
      goto LAB_0031247e;
    }
  }
  pMVar7 = (MessageLite *)0x0;
LAB_0031247e:
  if (pMVar7 == (MessageLite *)0x0) {
    if ((((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).current_size_ == 0)
    {
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar3 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
      plVar6 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar6 == (long *)0x0) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x111);
        other = LogMessage::operator<<(&local_60,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
      }
    }
    else {
      plVar6 = (long *)((((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_
                       )->elements[0];
    }
    pMVar7 = (MessageLite *)(**(code **)(*plVar6 + 0x20))(plVar6,this->arena_);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar4->field_0).int64_value,pMVar7);
  }
  return pMVar7;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}